

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_stream_split_decoder.cpp
# Opt level: O1

void __thiscall
duckdb::ByteStreamSplitDecoder::Skip(ByteStreamSplitDecoder *this,uint8_t *defines,idx_t skip_count)

{
  type tVar1;
  pointer pBVar2;
  runtime_error *this_00;
  idx_t iVar3;
  idx_t iVar4;
  
  iVar3 = skip_count;
  if (defines != (uint8_t *)0x0) {
    if (skip_count == 0) {
      iVar3 = 0;
    }
    else {
      iVar4 = 0;
      iVar3 = 0;
      do {
        iVar3 = iVar3 + (this->reader->column_schema->max_define == (ulong)defines[iVar4]);
        iVar4 = iVar4 + 1;
      } while (skip_count != iVar4);
    }
  }
  tVar1 = this->reader->column_schema->parquet_type;
  if (tVar1 == DOUBLE) {
    pBVar2 = unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true>::
             operator->(&this->bss_decoder);
    BssDecoder::Skip<double>(pBVar2,(uint32_t)iVar3);
    return;
  }
  if (tVar1 != FLOAT) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_00,"BYTE_STREAM_SPLIT encoding is only supported for FLOAT or DOUBLE data");
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar2 = unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true>::operator->
                     (&this->bss_decoder);
  BssDecoder::Skip<float>(pBVar2,(uint32_t)iVar3);
  return;
}

Assistant:

void ByteStreamSplitDecoder::Skip(uint8_t *defines, idx_t skip_count) {
	idx_t valid_count = reader.GetValidCount(defines, skip_count);
	switch (reader.Schema().parquet_type) {
	case duckdb_parquet::Type::FLOAT:
		bss_decoder->Skip<float>(valid_count);
		break;
	case duckdb_parquet::Type::DOUBLE:
		bss_decoder->Skip<double>(valid_count);
		break;
	default:
		throw std::runtime_error("BYTE_STREAM_SPLIT encoding is only supported for FLOAT or DOUBLE data");
	}
}